

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-entry-renderers.c
# Opt level: O0

wchar_t ui_entry_renderer_query_combined_width(wchar_t ind)

{
  renderer_info *prVar1;
  wchar_t local_1c;
  renderer_info *combined_renderer;
  wchar_t ind_local;
  
  if ((((ind < L'\x01') || (renderer_count < ind)) ||
      (renderers[ind + L'\xffffffff'].combined_renderer_index < L'\x01')) ||
     (renderer_count < renderers[ind + L'\xffffffff'].combined_renderer_index)) {
    combined_renderer._4_4_ = L'\xffffffff';
  }
  else {
    prVar1 = renderers + (renderers[ind + L'\xffffffff'].combined_renderer_index + L'\xffffffff');
    if (prVar1->backend == (backend_info *)0x0) {
      local_1c = L'\xffffffff';
    }
    else {
      local_1c = (*prVar1->backend->vw_func)(prVar1);
    }
    combined_renderer._4_4_ = local_1c;
  }
  return combined_renderer._4_4_;
}

Assistant:

int ui_entry_renderer_query_combined_width(int ind)
{
	const struct renderer_info *combined_renderer;

	if (ind <= 0 || ind > renderer_count ||
		renderers[ind - 1].combined_renderer_index <= 0 ||
		renderers[ind - 1].combined_renderer_index > renderer_count) {
		return -1;
	}
	combined_renderer =
		&renderers[renderers[ind - 1].combined_renderer_index - 1];
	return (combined_renderer->backend) ?
		(*combined_renderer->backend->vw_func)(combined_renderer) : -1;
}